

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall
ON_NurbsSurface::GetParameterTolerance
          (ON_NurbsSurface *this,int dir,double t,double *tminus,double *tplus)

{
  bool bVar1;
  double dVar2;
  double t1;
  double t0;
  double dVar3;
  ON_Interval d;
  ON_Interval local_38;
  
  (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])();
  dVar2 = ON_Interval::Min(&local_38);
  t1 = ON_Interval::Max(&local_38);
  if (t1 < dVar2) {
    bVar1 = false;
  }
  else {
    bVar1 = dir != 0;
    dVar3 = this->m_knot[bVar1][(long)this->m_order[bVar1] + -1];
    if ((t < dVar3) ||
       (t0 = this->m_knot[bVar1][(long)this->m_cv_count[bVar1] + -2], dVar3 = t1, t <= t0)) {
      t0 = dVar2;
      t1 = dVar3;
    }
    bVar1 = ON_GetParameterTolerance(t0,t1,t,tminus,tplus);
  }
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::GetParameterTolerance( // returns tminus < tplus: parameters tminus <= s <= tplus
       int dir,
       double t,       // t = parameter in domain
       double* tminus, // tminus
       double* tplus   // tplus
       ) const
{
  bool rc = false;
  ON_Interval d = Domain(dir);
  double t0 = d.Min();
  double t1 = d.Max();
  if ( t0 <= t1 ) {
    const double* knot = Knot(dir);
    const int order = Order(dir);
    const int cv_count = CVCount(dir);
    if ( t < knot[order-1] )
      t1 = knot[order-1];
    else if ( t > knot[cv_count-2] )
      t0 = knot[cv_count-2];
    rc = ON_GetParameterTolerance( t0, t1, t, tminus, tplus );
  }
  return rc;
}